

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

StructElement * __thiscall
soul::PoolAllocator::
allocate<soul::heart::StructElement,soul::CodeLocation&,soul::heart::Expression&,std::__cxx11::string>
          (PoolAllocator *this,CodeLocation *args,Expression *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  PoolItem *pPVar1;
  CodeLocation local_60;
  string local_50;
  
  pPVar1 = allocateSpaceForObject(this,0x40);
  local_60.sourceCode.object = (args->sourceCode).object;
  if (local_60.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_60.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_60.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_60.location.data = (args->location).data;
  std::__cxx11::string::string((string *)&local_50,(string *)args_2);
  heart::StructElement::StructElement((StructElement *)&pPVar1->item,&local_60,args_1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_60.sourceCode);
  pPVar1->destructor =
       allocate<soul::heart::StructElement,_soul::CodeLocation_&,_soul::heart::Expression_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::anon_class_1_0_00000001::__invoke;
  return (StructElement *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }